

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O2

ReadStatus __thiscall
PartiallyDownloadedBlock::FillBlock
          (PartiallyDownloadedBlock *this,CBlock *block,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx_missing)

{
  CBlockHeader *this_00;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_01;
  long lVar1;
  pointer psVar2;
  bool bVar3;
  CChainParams *__args_2;
  ReadStatus RVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  string *this_02;
  size_t i;
  ulong uVar8;
  pointer psVar9;
  long lVar10;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  CheckBlockFn check_block;
  string local_108;
  string local_e8;
  BlockValidationState state;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_78;
  uint256 hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->header).nBits == 0) {
LAB_006bc5f8:
    RVar4 = READ_STATUS_INVALID;
  }
  else {
    this_00 = &this->header;
    CBlockHeader::GetHash(&hash,this_00);
    CBlock::CBlock((CBlock *)&state,this_00);
    CBlock::operator=(block,(CBlock *)&state);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_78);
    this_01 = &block->vtx;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::resize(this_01,(long)(this->txn_available).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->txn_available).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
    lVar10 = 0;
    uVar5 = 0;
    for (uVar8 = 0;
        psVar9 = (this->txn_available).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(this->txn_available).
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4);
        uVar8 = uVar8 + 1) {
      if (*(long *)((long)&(psVar9->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar10) == 0) {
        psVar9 = (vtx_missing->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(vtx_missing->
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4) <= uVar5)
        goto LAB_006bc5f8;
        uVar6 = uVar5 + 1;
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(((this_01->
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar10),
                   &psVar9[uVar5].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                  );
      }
      else {
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(((this_01->
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar10),
                   (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(psVar9->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar10));
        uVar6 = uVar5;
      }
      lVar10 = lVar10 + 0x10;
      uVar5 = uVar6;
    }
    CBlockHeader::SetNull(this_00);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::clear(&this->txn_available);
    RVar4 = READ_STATUS_INVALID;
    if ((long)(vtx_missing->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(vtx_missing->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 4 == uVar5) {
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
      state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
      state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
           '\0';
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
           '\0';
      if ((this->m_check_block_mock).super__Function_base._M_manager == (_Manager_type)0x0) {
        check_block.super__Function_base._M_functor._8_8_ = 0;
        check_block.super__Function_base._M_functor._M_unused._M_object = CheckBlock;
        check_block._M_invoker =
             std::
             _Function_handler<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool),_bool_(*)(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
             ::_M_invoke;
        check_block.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool),_bool_(*)(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
             ::_M_manager;
      }
      else {
        std::
        function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
        ::function(&check_block,&this->m_check_block_mock);
      }
      __args_2 = Params();
      this_02 = (string *)&check_block;
      bVar3 = std::
              function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
              ::operator()((function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                            *)this_02,block,&state,&__args_2->consensus,true,true);
      if (bVar3) {
        bVar3 = ::LogAcceptCategory((LogFlags)this_02,(Level)block);
        pcVar7 = (char *)block;
        if (bVar3) {
          base_blob<256u>::ToString_abi_cxx11_(&local_e8,(base_blob<256u> *)&hash);
          local_108._M_dataplus._M_p =
               (pointer)((long)(vtx_missing->
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(vtx_missing->
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 4);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
          ;
          source_file._M_len = 0x62;
          logging_function._M_str = "FillBlock";
          logging_function._M_len = 9;
          pcVar7 = "FillBlock";
          LogPrintFormatInternal<std::__cxx11::string,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                    (logging_function,source_file,0xdc,CMPCTBLOCK,Debug,
                     (ConstevalFormatString<5U>)0xc8cae0,&local_e8,&this->prefilled_count,
                     &this->mempool_count,&this->extra_count,(unsigned_long *)&local_108);
          this_02 = &local_e8;
          std::__cxx11::string::~string((string *)this_02);
        }
        psVar9 = (vtx_missing->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (vtx_missing->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        RVar4 = READ_STATUS_OK;
        if ((ulong)((long)psVar2 - (long)psVar9) < 0x41) {
          for (; psVar9 != psVar2; psVar9 = psVar9 + 1) {
            bVar3 = ::LogAcceptCategory((LogFlags)this_02,(Level)pcVar7);
            if (bVar3) {
              base_blob<256u>::ToString_abi_cxx11_(&local_e8,(base_blob<256u> *)&hash);
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_108,
                         (base_blob<256u> *)
                         &((psVar9->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->hash);
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
              ;
              source_file_00._M_len = 0x62;
              logging_function_00._M_str = "FillBlock";
              logging_function_00._M_len = 9;
              pcVar7 = "FillBlock";
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_00,source_file_00,0xdf,CMPCTBLOCK,Debug,
                         (ConstevalFormatString<2U>)0xc8cb6c,&local_e8,&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              this_02 = &local_e8;
              std::__cxx11::string::~string((string *)&local_e8);
            }
          }
        }
      }
      else {
        RVar4 = state.super_ValidationState<BlockValidationResult>.m_result == BLOCK_MUTATED ^
                READ_STATUS_CHECKBLOCK_FAILED;
      }
      std::_Function_base::~_Function_base(&check_block.super__Function_base);
      ValidationState<BlockValidationResult>::~ValidationState
                (&state.super_ValidationState<BlockValidationResult>);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return RVar4;
  }
  __stack_chk_fail();
}

Assistant:

ReadStatus PartiallyDownloadedBlock::FillBlock(CBlock& block, const std::vector<CTransactionRef>& vtx_missing)
{
    if (header.IsNull()) return READ_STATUS_INVALID;

    uint256 hash = header.GetHash();
    block = header;
    block.vtx.resize(txn_available.size());

    size_t tx_missing_offset = 0;
    for (size_t i = 0; i < txn_available.size(); i++) {
        if (!txn_available[i]) {
            if (vtx_missing.size() <= tx_missing_offset)
                return READ_STATUS_INVALID;
            block.vtx[i] = vtx_missing[tx_missing_offset++];
        } else
            block.vtx[i] = std::move(txn_available[i]);
    }

    // Make sure we can't call FillBlock again.
    header.SetNull();
    txn_available.clear();

    if (vtx_missing.size() != tx_missing_offset)
        return READ_STATUS_INVALID;

    BlockValidationState state;
    CheckBlockFn check_block = m_check_block_mock ? m_check_block_mock : CheckBlock;
    if (!check_block(block, state, Params().GetConsensus(), /*fCheckPoW=*/true, /*fCheckMerkleRoot=*/true)) {
        // TODO: We really want to just check merkle tree manually here,
        // but that is expensive, and CheckBlock caches a block's
        // "checked-status" (in the CBlock?). CBlock should be able to
        // check its own merkle root and cache that check.
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED)
            return READ_STATUS_FAILED; // Possible Short ID collision
        return READ_STATUS_CHECKBLOCK_FAILED;
    }

    LogDebug(BCLog::CMPCTBLOCK, "Successfully reconstructed block %s with %lu txn prefilled, %lu txn from mempool (incl at least %lu from extra pool) and %lu txn requested\n", hash.ToString(), prefilled_count, mempool_count, extra_count, vtx_missing.size());
    if (vtx_missing.size() < 5) {
        for (const auto& tx : vtx_missing) {
            LogDebug(BCLog::CMPCTBLOCK, "Reconstructed block %s required tx %s\n", hash.ToString(), tx->GetHash().ToString());
        }
    }

    return READ_STATUS_OK;
}